

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::Expression> __thiscall minja::Parser::parseArray(Parser *this)

{
  shared_ptr<minja::Expression> *psVar1;
  size_type sVar2;
  runtime_error *prVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Parser *pPVar5;
  Parser *in_RSI;
  shared_ptr<minja::Expression> sVar6;
  allocator<char> local_a9;
  shared_ptr<minja::Expression> expr;
  string local_88;
  Parser *local_60;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  elements;
  shared_ptr<minja::Expression> first_expr;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"[",(allocator<char> *)&elements);
  local_60 = this;
  consumeToken((string *)&expr,in_RSI,&local_88,Strip);
  _Var4 = expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::~string((string *)&expr);
  std::__cxx11::string::~string((string *)&local_88);
  if (_Var4._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (local_60->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (local_60->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var4._M_pi = extraout_RDX;
  }
  else {
    elements.
    super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elements.
    super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    elements.
    super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"]",(allocator<char> *)&first_expr);
    consumeToken((string *)&expr,in_RSI,&local_88,Strip);
    _Var4 = expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::~string((string *)&expr);
    std::__cxx11::string::~string((string *)&local_88);
    if (_Var4._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      parseExpression((Parser *)&first_expr,SUB81(in_RSI,0));
      if (first_expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Expected first expression in array");
      }
      else {
        std::
        vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
        ::emplace_back<std::shared_ptr<minja::Expression>>
                  ((vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
                    *)&elements,&first_expr);
        while ((in_RSI->it)._M_current != (in_RSI->end)._M_current) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,",",&local_a9);
          consumeToken((string *)&expr,in_RSI,&local_88,Strip);
          _Var4 = expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ;
          std::__cxx11::string::~string((string *)&expr);
          std::__cxx11::string::~string((string *)&local_88);
          if (_Var4._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"]",&local_a9);
            consumeToken((string *)&expr,in_RSI,&local_88,Strip);
            std::__cxx11::string::~string((string *)&expr);
            std::__cxx11::string::~string((string *)&local_88);
            if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              get_location((Location *)&expr,in_RSI);
              pPVar5 = local_60;
              std::
              make_shared<minja::ArrayExpr,minja::Location,std::vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>>
                        ((Location *)&local_88,
                         (vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                          *)&expr);
              sVar2 = local_88._M_string_length;
              local_88._M_string_length = 0;
              (pPVar5->template_str).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)local_88._M_dataplus._M_p;
              (pPVar5->template_str).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2;
              local_88._M_dataplus._M_p = (pointer)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              psVar1 = &first_expr;
              goto LAB_001a9145;
            }
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar3,"Expected comma or closing bracket in array");
            goto LAB_001a9183;
          }
          parseExpression((Parser *)&expr,SUB81(in_RSI,0));
          if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar3,"Expected expression in array");
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::
          vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
          ::emplace_back<std::shared_ptr<minja::Expression>>
                    ((vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
                      *)&elements,&expr);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Expected closing bracket");
      }
LAB_001a9183:
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    get_location((Location *)&expr,in_RSI);
    pPVar5 = local_60;
    std::
    make_shared<minja::ArrayExpr,minja::Location,std::vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>>
              ((Location *)&local_88,
               (vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                *)&expr);
    sVar2 = local_88._M_string_length;
    local_88._M_string_length = 0;
    (pPVar5->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_88._M_dataplus._M_p;
    (pPVar5->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2;
    local_88._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
    psVar1 = &expr;
LAB_001a9145:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(psVar1->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    std::
    vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ::~vector(&elements);
    _Var4._M_pi = extraout_RDX_00;
    local_60 = pPVar5;
  }
  sVar6.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar6.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_60;
  return (shared_ptr<minja::Expression>)
         sVar6.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseArray() {
        if (consumeToken("[").empty()) return nullptr;

        std::vector<std::shared_ptr<Expression>> elements;
        if (!consumeToken("]").empty()) {
            return std::make_shared<ArrayExpr>(get_location(), std::move(elements));
        }
        auto first_expr = parseExpression();
        if (!first_expr) throw std::runtime_error("Expected first expression in array");
        elements.push_back(std::move(first_expr));

        while (it != end) {
            if (!consumeToken(",").empty()) {
              auto expr = parseExpression();
              if (!expr) throw std::runtime_error("Expected expression in array");
              elements.push_back(std::move(expr));
            } else if (!consumeToken("]").empty()) {
                return std::make_shared<ArrayExpr>(get_location(), std::move(elements));
            } else {
                throw std::runtime_error("Expected comma or closing bracket in array");
            }
        }
        throw std::runtime_error("Expected closing bracket");
    }